

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma.cpp
# Opt level: O2

bool __thiscall
stream::lzma_decompressor_impl_base::filter
          (lzma_decompressor_impl_base *this,char **begin_in,char *end_in,char **begin_out,
          char *end_out,bool flush)

{
  long *plVar1;
  char *pcVar2;
  uint code;
  lzma_error *plVar3;
  allocator<char> local_49;
  string local_48;
  
  plVar1 = (long *)this->stream;
  pcVar2 = *begin_in;
  *plVar1 = (long)pcVar2;
  plVar1[1] = (long)end_in - (long)pcVar2;
  pcVar2 = *begin_out;
  plVar1[3] = (long)pcVar2;
  plVar1[4] = (long)end_out - (long)pcVar2;
  code = lzma_code(plVar1,0);
  if (code == 10 && flush) {
    if (plVar1[4] != 0) {
      plVar3 = (lzma_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"truncated lzma stream",&local_49);
      lzma_error::lzma_error(plVar3,&local_48,10);
      __cxa_throw(plVar3,&lzma_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
    }
    *begin_in = (char *)*plVar1;
    *begin_out = (char *)plVar1[3];
  }
  else {
    *begin_in = (char *)*plVar1;
    *begin_out = (char *)plVar1[3];
    if ((10 < code) || ((0x403U >> (code & 0x1f) & 1) == 0)) {
      plVar3 = (lzma_error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"lzma decrompression error",&local_49);
      lzma_error::lzma_error(plVar3,&local_48,code);
      __cxa_throw(plVar3,&lzma_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
  return code != 1;
}

Assistant:

bool lzma_decompressor_impl_base::filter(const char * & begin_in, const char * end_in,
                                         char * & begin_out, char * end_out, bool flush) {
	
	lzma_stream * strm = static_cast<lzma_stream *>(stream);
	
	strm->next_in = reinterpret_cast<const boost::uint8_t *>(begin_in);
	strm->avail_in = size_t(end_in - begin_in);
	
	strm->next_out = reinterpret_cast<boost::uint8_t *>(begin_out);
	strm->avail_out = size_t(end_out - begin_out);
	
	lzma_ret ret = lzma_code(strm, LZMA_RUN);
	
	if(flush && ret == LZMA_BUF_ERROR && strm->avail_out > 0) {
		throw lzma_error("truncated lzma stream", ret);
	}
	
	begin_in = reinterpret_cast<const char *>(strm->next_in);
	begin_out = reinterpret_cast<char *>(strm->next_out);
	
	if(ret != LZMA_OK && ret != LZMA_STREAM_END && ret != LZMA_BUF_ERROR) {
		throw lzma_error("lzma decrompression error", ret);
	}
	
	return (ret != LZMA_STREAM_END);
}